

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  int extraout_EAX;
  undefined8 uVar3;
  anon_union_8_2_26168aa3_for_data aVar4;
  __sighandler_t p_Var5;
  uv_process_options_t *puVar6;
  passwd *ppVar7;
  ssize_t sVar8;
  uv_buf_t *buf;
  uv_process_t *puVar9;
  uv_process_t *puVar10;
  code *nread;
  uv_timer_t *puVar11;
  uv_process_options_t *__s;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_7f8 [16];
  uv_handle_type uStack_7e8;
  undefined4 uStack_7e0;
  undefined4 uStack_7d0;
  uv_stream_t uStack_7b8;
  anon_union_8_2_26168aa3_for_data aStack_6b0;
  int iStack_69c;
  uv_stdio_container_t uStack_698;
  undefined1 auStack_680 [16];
  undefined1 auStack_670 [264];
  undefined1 auStack_568 [440];
  undefined1 auStack_3b0 [192];
  anon_union_8_2_26168aa3_for_data aStack_2f0;
  uv_process_options_t *puStack_2e8;
  anon_union_8_2_26168aa3_for_data aStack_2e0;
  anon_union_8_2_26168aa3_for_data aStack_2d8;
  anon_union_8_2_26168aa3_for_data aStack_2d0;
  char acStack_2ba [10];
  anon_union_8_2_26168aa3_for_data aStack_2b0;
  sigset_t sStack_290;
  anon_union_8_2_26168aa3_for_data aStack_210;
  undefined1 local_208 [16];
  uv_stdio_container_t local_1f8 [2];
  undefined1 local_1d8 [264];
  undefined1 local_d0 [192];
  
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e099;
  init_process_options("spawn_helper3",exit_cb);
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e09e;
  uVar3 = uv_default_loop();
  aVar4.stream = (uv_stream_t *)local_1d8;
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e0b0;
  uv_pipe_init(uVar3,aVar4.stream,0);
  options.stdio = local_1f8;
  __s = &options;
  local_1f8[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e0de;
  local_1f8[0].data.stream = aVar4.stream;
  close(0);
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e0e3;
  uVar3 = uv_default_loop();
  aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e0f5;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e10e;
    local_208 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e139;
    iVar1 = uv_write(local_d0,local_1d8,local_208,1,write_cb);
    if (iVar1 != 0) goto LAB_0016e1a8;
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e142;
    uVar3 = uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e14c;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e1ad;
    if (exit_cb_called != 1) goto LAB_0016e1b2;
    if (close_cb_called != 2) goto LAB_0016e1b7;
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e167;
    aVar4.stream = (uv_stream_t *)uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e17b;
    uv_walk(aVar4.stream,close_walk_cb,0);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e185;
    uv_run(aVar4.stream,0);
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e18a;
    uVar3 = uv_default_loop();
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e192;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1a8;
    run_test_spawn_closed_process_io_cold_1();
LAB_0016e1a8:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1ad;
    run_test_spawn_closed_process_io_cold_2();
LAB_0016e1ad:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1b2;
    run_test_spawn_closed_process_io_cold_3();
LAB_0016e1b2:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1b7;
    run_test_spawn_closed_process_io_cold_4();
LAB_0016e1b7:
    aStack_210 = (anon_union_8_2_26168aa3_for_data)0x16e1bc;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_210.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  puVar6 = (uv_process_options_t *)&sStack_290;
  aStack_210 = aVar4;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_290);
  sigaddset(&sStack_290,0xf);
  iVar1 = pthread_sigmask(0,&sStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var5 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e31f;
    uVar3 = uv_default_loop();
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) goto LAB_0016e324;
    sigemptyset(&sStack_290);
    sigaddset(&sStack_290,0xf);
    iVar1 = pthread_sigmask(1,&sStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_0016e329;
    p_Var5 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_0016e32e;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_0016e333;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_0016e338;
    uVar3 = uv_default_loop();
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e33d;
    if (exit_cb_called != 1) goto LAB_0016e342;
    if (close_cb_called != 1) goto LAB_0016e347;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_0016e31f:
    run_test_kill_cold_11();
LAB_0016e324:
    run_test_kill_cold_2();
LAB_0016e329:
    run_test_kill_cold_3();
LAB_0016e32e:
    run_test_kill_cold_10();
LAB_0016e333:
    run_test_kill_cold_4();
LAB_0016e338:
    run_test_kill_cold_5();
LAB_0016e33d:
    run_test_kill_cold_6();
LAB_0016e342:
    run_test_kill_cold_7();
LAB_0016e347:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e361;
  aStack_2b0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 != 0) {
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e488;
    run_test_spawn_setuid_setgid_cold_1();
    return 1;
  }
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e37c;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e388;
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4a0;
    run_test_spawn_setuid_setgid_cold_8();
LAB_0016e4a0:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4a5;
    run_test_spawn_setuid_setgid_cold_7();
LAB_0016e4a5:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4aa;
    run_test_spawn_setuid_setgid_cold_2();
LAB_0016e4aa:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4af;
    run_test_spawn_setuid_setgid_cold_3();
LAB_0016e4af:
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e4b4;
    run_test_spawn_setuid_setgid_cold_4();
  }
  else {
    options.uid = ppVar7->pw_uid;
    options.gid = ppVar7->pw_gid;
    puVar6 = &options;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e3c4;
    snprintf(acStack_2ba,10,"%d");
    __s = (uv_process_options_t *)&stack0xfffffffffffffd3c;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e3df;
    snprintf((char *)__s,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = acStack_2ba;
    options.args[3] = (char *)__s;
    options.flags = 3;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e404;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e416;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) {
        aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e494;
        run_test_spawn_setuid_setgid_cold_6();
        return 1;
      }
      goto LAB_0016e4a0;
    }
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e41f;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e429;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016e4a5;
    if (exit_cb_called != 1) goto LAB_0016e4aa;
    if (close_cb_called != 1) goto LAB_0016e4af;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e444;
    __s = (uv_process_options_t *)uv_default_loop();
    puVar6 = (uv_process_options_t *)0x0;
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e45a;
    uv_walk(__s,close_walk_cb,0);
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e464;
    uv_run(__s);
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e469;
    uVar3 = uv_default_loop();
    aStack_2d0 = (anon_union_8_2_26168aa3_for_data)0x16e471;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_2d0.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_5();
  aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e4bf;
  aStack_2d0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e4cf;
    aVar4.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar4.stream == (uv_stream_t *)0x0) goto LAB_0016e5aa;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e4e3;
    iVar1 = setgid(*(__gid_t *)&(aVar4.stream)->field_0x14);
    puVar6 = (uv_process_options_t *)aVar4.stream;
    if (iVar1 != 0) goto LAB_0016e5af;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e4f3;
    iVar1 = setuid((aVar4.stream)->type);
    if (iVar1 == 0) goto LAB_0016e4fb;
  }
  else {
LAB_0016e4fb:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e50e;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options._56_8_ = options._56_8_ & 0xffffffff00000000;
    options.flags = options.flags | 0x75;
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e52b;
    uVar3 = uv_default_loop();
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e53d;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e547;
      uVar3 = uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e551;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e59b;
      if (close_cb_called != 0) goto LAB_0016e5a0;
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e563;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e577;
      uv_walk(puVar6,close_walk_cb,0);
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e581;
      uv_run(puVar6);
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e586;
      uVar3 = uv_default_loop();
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e58e;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e59b;
      run_test_spawn_setuid_fails_cold_3();
LAB_0016e59b:
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e5a0;
      run_test_spawn_setuid_fails_cold_4();
LAB_0016e5a0:
      aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e5a5;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e5aa;
    run_test_spawn_setuid_fails_cold_6();
LAB_0016e5aa:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e5af;
    run_test_spawn_setuid_fails_cold_7();
LAB_0016e5af:
    aStack_2d8 = (anon_union_8_2_26168aa3_for_data)0x16e5b4;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_2d8.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e5bf;
  aStack_2d8 = (anon_union_8_2_26168aa3_for_data)puVar6;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e5cf;
    aVar4.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar4.stream == (uv_stream_t *)0x0) goto LAB_0016e6aa;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e5e3;
    iVar1 = setgid(*(__gid_t *)&(aVar4.stream)->field_0x14);
    puVar6 = (uv_process_options_t *)aVar4.stream;
    if (iVar1 != 0) goto LAB_0016e6af;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e5f3;
    iVar1 = setuid((aVar4.stream)->type);
    if (iVar1 == 0) goto LAB_0016e5fb;
  }
  else {
LAB_0016e5fb:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e60e;
    init_process_options("spawn_helper1",fail_cb);
    puVar6 = &options;
    options.flags = options.flags | 2;
    options._56_8_ = options._56_8_ & 0xffffffff;
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e62b;
    uVar3 = uv_default_loop();
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e63d;
    iVar1 = uv_spawn(uVar3,&process,&options);
    if (iVar1 == -1) {
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e647;
      uVar3 = uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e651;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0016e69b;
      if (close_cb_called != 0) goto LAB_0016e6a0;
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e663;
      puVar6 = (uv_process_options_t *)uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e677;
      uv_walk(puVar6,close_walk_cb,0);
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e681;
      uv_run(puVar6);
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e686;
      uVar3 = uv_default_loop();
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e68e;
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
    }
    else {
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e69b;
      run_test_spawn_setgid_fails_cold_3();
LAB_0016e69b:
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e6a0;
      run_test_spawn_setgid_fails_cold_4();
LAB_0016e6a0:
      aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e6a5;
      run_test_spawn_setgid_fails_cold_5();
    }
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e6aa;
    run_test_spawn_setgid_fails_cold_6();
LAB_0016e6aa:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e6af;
    run_test_spawn_setgid_fails_cold_7();
LAB_0016e6af:
    aStack_2e0 = (anon_union_8_2_26168aa3_for_data)0x16e6b4;
    run_test_spawn_setgid_fails_cold_1();
  }
  aStack_2e0.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_setgid_fails_cold_2();
  puStack_2e8 = (uv_process_options_t *)0x16e6c8;
  aStack_2e0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_2e8 = (uv_process_options_t *)0x16e6cd;
  uVar3 = uv_default_loop();
  puStack_2e8 = (uv_process_options_t *)0x16e6e3;
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    puStack_2e8 = (uv_process_options_t *)0x16e6f0;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e6fa;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e77d;
    puStack_2e8 = (uv_process_options_t *)0x16e70a;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 0) goto LAB_0016e782;
    puStack_2e8 = (uv_process_options_t *)0x16e71c;
    uv_close(&process,0);
    puStack_2e8 = (uv_process_options_t *)0x16e721;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e72b;
    iVar1 = uv_run(uVar3,0);
    if (iVar1 != 0) goto LAB_0016e787;
    puStack_2e8 = (uv_process_options_t *)0x16e73b;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 1) goto LAB_0016e78c;
    puStack_2e8 = (uv_process_options_t *)0x16e745;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e759;
    uv_walk(puVar6,close_walk_cb,0);
    puStack_2e8 = (uv_process_options_t *)0x16e763;
    uv_run(puVar6,0);
    puStack_2e8 = (uv_process_options_t *)0x16e768;
    uVar3 = uv_default_loop();
    puStack_2e8 = (uv_process_options_t *)0x16e770;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_2e8 = (uv_process_options_t *)0x16e77d;
    run_test_spawn_auto_unref_cold_1();
LAB_0016e77d:
    puStack_2e8 = (uv_process_options_t *)0x16e782;
    run_test_spawn_auto_unref_cold_2();
LAB_0016e782:
    puStack_2e8 = (uv_process_options_t *)0x16e787;
    run_test_spawn_auto_unref_cold_3();
LAB_0016e787:
    puStack_2e8 = (uv_process_options_t *)0x16e78c;
    run_test_spawn_auto_unref_cold_4();
LAB_0016e78c:
    puStack_2e8 = (uv_process_options_t *)0x16e791;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_2e8 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  nread = (code *)auStack_568;
  aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e7c1;
  aStack_2f0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  puStack_2e8 = __s;
  iStack_69c = uv_fs_open(0,nread,"/dev/null",2,0,0);
  if (iStack_69c < 0) {
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e91e;
    run_test_spawn_fs_open_cold_1();
LAB_0016e91e:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e923;
    run_test_spawn_fs_open_cold_2();
LAB_0016e923:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e928;
    run_test_spawn_fs_open_cold_3();
LAB_0016e928:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e92d;
    run_test_spawn_fs_open_cold_4();
LAB_0016e92d:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e932;
    run_test_spawn_fs_open_cold_5();
LAB_0016e932:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e937;
    run_test_spawn_fs_open_cold_6();
LAB_0016e937:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e93c;
    run_test_spawn_fs_open_cold_7();
LAB_0016e93c:
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e941;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e7da;
    uv_fs_req_cleanup(auStack_568);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e7ed;
    init_process_options("spawn_helper8",exit_cb);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e7f2;
    uVar3 = uv_default_loop();
    puVar6 = (uv_process_options_t *)auStack_670;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e804;
    nread = (code *)puVar6;
    iVar1 = uv_pipe_init(uVar3,puVar6,0);
    if (iVar1 != 0) goto LAB_0016e91e;
    options.stdio = &uStack_698;
    uStack_698.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e838;
    uStack_698.data.stream = (uv_stream_t *)puVar6;
    uVar3 = uv_default_loop();
    puVar9 = &process;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e84a;
    iVar1 = uv_spawn(uVar3,&process,&options);
    nread = (code *)puVar9;
    if (iVar1 != 0) goto LAB_0016e923;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e861;
    auStack_680 = uv_buf_init(&iStack_69c,4);
    nread = (code *)auStack_670;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e88e;
    iVar1 = uv_write(auStack_3b0,nread,auStack_680,1,write_cb);
    if (iVar1 != 0) goto LAB_0016e928;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e89b;
    uVar3 = uv_default_loop();
    nread = (code *)0x0;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e8a5;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0016e92d;
    nread = (code *)auStack_568;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e8c2;
    iVar1 = uv_fs_close(0,nread,iStack_69c,0);
    if (iVar1 != 0) goto LAB_0016e932;
    if (exit_cb_called != 1) goto LAB_0016e937;
    if (close_cb_called != 2) goto LAB_0016e93c;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e8dd;
    puVar6 = (uv_process_options_t *)uv_default_loop();
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e8f1;
    uv_walk(puVar6,close_walk_cb,0);
    nread = (code *)0x0;
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e8fb;
    uv_run(puVar6);
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e900;
    uVar3 = uv_default_loop();
    aStack_6b0 = (anon_union_8_2_26168aa3_for_data)0x16e908;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_6b0.stream = (uv_stream_t *)run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar9 = (uv_process_t *)auStack_7f8;
  aStack_6b0 = (anon_union_8_2_26168aa3_for_data)puVar6;
  iVar1 = pipe((int *)puVar9);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_7f8 + 8);
    auStack_7f8._8_4_ = 2;
    uStack_7e8 = auStack_7f8._0_4_;
    uStack_7e0 = 0;
    uStack_7d0 = 0;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar10 = &process;
    iVar1 = uv_spawn(puVar9,&process,&options);
    nread = (code *)puVar10;
    if (iVar1 != 0) goto LAB_0016eb8a;
    uv_unref(&process);
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_7b8;
    iVar1 = uv_pipe_init(puVar9,nread,0);
    if (iVar1 != 0) goto LAB_0016eb8f;
    nread._4_4_ = 0;
    nread._0_4_ = auStack_7f8._0_4_;
    puVar9 = (uv_process_t *)&uStack_7b8;
    iVar1 = uv_pipe_open();
    if (iVar1 != 0) goto LAB_0016eb94;
    auStack_7f8._0_4_ = ~UV_UNKNOWN_HANDLE;
    nread = on_alloc;
    puVar9 = (uv_process_t *)&uStack_7b8;
    iVar1 = uv_read_start(puVar9,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016eb99;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    nread = (code *)0x1802fd;
    sVar8 = write(auStack_7f8._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016eb9e;
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016eba3;
    if (output_used != 1) goto LAB_0016eba8;
    uv_close(&uStack_7b8,close_cb);
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    nread = (code *)0x1802fd;
    sVar8 = write(auStack_7f8._4_4_,"",1);
    if (sVar8 != 1) goto LAB_0016ebad;
    puVar9 = (uv_process_t *)uv_default_loop();
    puVar11 = &timer;
    iVar1 = uv_timer_init();
    nread = (code *)puVar11;
    if (iVar1 != 0) goto LAB_0016ebb2;
    puVar11 = &timer;
    nread = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar9 = (uv_process_t *)puVar11;
    if (iVar1 != 0) goto LAB_0016ebb7;
    puVar9 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 == 1) {
      puVar9 = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar1 = uv_run();
      if (iVar1 != 0) goto LAB_0016ebd0;
    }
    if (timer_counter != 1) goto LAB_0016ebbc;
    puVar9 = &process;
    nread = (code *)0xf;
    iVar1 = uv_process_kill();
    if (iVar1 != 0) goto LAB_0016ebc1;
    puVar9 = (uv_process_t *)(ulong)(uint)auStack_7f8._4_4_;
    iVar1 = close(auStack_7f8._4_4_);
    if (iVar1 != 0) goto LAB_0016ebc6;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar3);
    puVar9 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016eb8a:
    run_test_closed_fd_events_cold_2();
LAB_0016eb8f:
    run_test_closed_fd_events_cold_3();
LAB_0016eb94:
    run_test_closed_fd_events_cold_4();
LAB_0016eb99:
    run_test_closed_fd_events_cold_5();
LAB_0016eb9e:
    run_test_closed_fd_events_cold_6();
LAB_0016eba3:
    run_test_closed_fd_events_cold_7();
LAB_0016eba8:
    run_test_closed_fd_events_cold_8();
LAB_0016ebad:
    run_test_closed_fd_events_cold_9();
LAB_0016ebb2:
    run_test_closed_fd_events_cold_10();
LAB_0016ebb7:
    run_test_closed_fd_events_cold_11();
LAB_0016ebbc:
    run_test_closed_fd_events_cold_13();
LAB_0016ebc1:
    run_test_closed_fd_events_cold_14();
LAB_0016ebc6:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016ebd0:
  run_test_closed_fd_events_cold_12();
  uv_read_stop();
  on_read((uv_stream_t *)puVar9,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}